

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_mapping_key_prolog
               (fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_key,_Bool simple_key)

{
  uint uVar1;
  fy_emitter_cfg_flags fVar2;
  undefined7 in_register_00000009;
  
  uVar1 = sc->flags & 0x10;
  sc->flags = uVar1 + 4;
  if ((((int)CONCAT71(in_register_00000009,simple_key) != 0) &&
      (sc->flags = uVar1 | 0xc, fyt_key != (fy_token *)0x0)) && (fyt_key->type == FYTT_SCALAR)) {
    sc->flags = uVar1 | 0x4c;
  }
  fVar2 = emit->cfg->flags & 0xf00000;
  if ((fVar2 != FYECF_MODE_FLOW_ONELINE) && (fVar2 != FYECF_MODE_JSON_ONELINE)) {
    fy_emit_write_indent(emit,sc->indent);
  }
  if ((sc->flags & 8U) == 0) {
    fy_emit_write_indicator(emit,di_question_mark,sc->flags,sc->indent,fyewt_indicator);
    return;
  }
  return;
}

Assistant:

static void fy_emit_mapping_key_prolog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                       struct fy_token *fyt_key, bool simple_key) {
    sc->flags = DDNF_MAP | (sc->flags & DDNF_FLOW);

    if (simple_key) {
        sc->flags |= DDNF_SIMPLE;
        if (fyt_key && fyt_key->type == FYTT_SCALAR)
            sc->flags |= DDNF_SIMPLE_SCALAR_KEY;
    }

    if (!fy_emit_is_oneline(emit))
        fy_emit_write_indent(emit, sc->indent);

    /* complex? */
    if (!(sc->flags & DDNF_SIMPLE))
        fy_emit_write_indicator(emit, di_question_mark, sc->flags, sc->indent, fyewt_indicator);
}